

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseDataObjectMeshVertexColors(XFileParser *this,Mesh *pMesh)

{
  uint uVar1;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *this_00;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  aiColor4D aVar5;
  undefined8 local_d4;
  undefined8 local_cc;
  allocator<char> local_c1;
  string local_c0;
  uint local_9c;
  uint local_98;
  uint index;
  uint a;
  allocator<char> local_81;
  string local_80;
  uint local_5c;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvStack_58;
  uint numColors;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *colors;
  allocator<char> local_39;
  string local_38;
  Mesh *local_18;
  Mesh *pMesh_local;
  XFileParser *this_local;
  
  local_18 = pMesh;
  pMesh_local = (Mesh *)this;
  readHeadOfDataObject(this,(string *)0x0);
  if (8 < local_18->mNumColorSets + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Too many colorsets",&local_39);
    ThrowException(this,&local_38);
  }
  uVar1 = local_18->mNumColorSets;
  local_18->mNumColorSets = uVar1 + 1;
  pvStack_58 = local_18->mColors + uVar1;
  local_5c = ReadInt(this);
  uVar2 = (ulong)local_5c;
  sVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                    (&local_18->mPositions);
  this_00 = pvStack_58;
  if (uVar2 == sVar3) {
    uVar2 = (ulong)local_5c;
    aiColor4t<float>::aiColor4t((aiColor4t<float> *)&index,0.0,0.0,0.0,1.0);
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
              (this_00,uVar2,(value_type *)&index);
    local_98 = 0;
    while( true ) {
      if (local_5c <= local_98) {
        CheckForClosingBrace(this);
        return;
      }
      local_9c = ReadInt(this);
      uVar2 = (ulong)local_9c;
      sVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        (&local_18->mPositions);
      if (sVar3 <= uVar2) break;
      aVar5 = ReadRGBA(this);
      pvVar4 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                         (pvStack_58,(ulong)local_9c);
      local_d4 = aVar5._0_8_;
      pvVar4->r = (float)(undefined4)local_d4;
      pvVar4->g = (float)local_d4._4_4_;
      local_cc = aVar5._8_8_;
      pvVar4->b = (float)(undefined4)local_cc;
      pvVar4->a = (float)local_cc._4_4_;
      if (((this->mIsBinaryFormat & 1U) == 0) &&
         ((FindNextNoneWhiteSpace(this), *this->mP == ';' || (*this->mP == ',')))) {
        this->mP = this->mP + 1;
      }
      local_98 = local_98 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"Vertex color index out of bounds",&local_c1);
    ThrowException(this,&local_c0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Vertex color count does not match vertex count",&local_81);
  ThrowException(this,&local_80);
}

Assistant:

void XFileParser::ParseDataObjectMeshVertexColors( Mesh* pMesh)
{
    readHeadOfDataObject();
    if( pMesh->mNumColorSets + 1 > AI_MAX_NUMBER_OF_COLOR_SETS)
        ThrowException( "Too many colorsets");
    std::vector<aiColor4D>& colors = pMesh->mColors[pMesh->mNumColorSets++];

    unsigned int numColors = ReadInt();
    if( numColors != pMesh->mPositions.size())
        ThrowException( "Vertex color count does not match vertex count");

    colors.resize( numColors, aiColor4D( 0, 0, 0, 1));
    for( unsigned int a = 0; a < numColors; a++)
    {
        unsigned int index = ReadInt();
        if( index >= pMesh->mPositions.size())
            ThrowException( "Vertex color index out of bounds");

        colors[index] = ReadRGBA();
        // HACK: (thom) Maxon Cinema XPort plugin puts a third separator here, kwxPort puts a comma.
        // Ignore gracefully.
        if( !mIsBinaryFormat)
        {
            FindNextNoneWhiteSpace();
            if( *mP == ';' || *mP == ',')
                mP++;
        }
    }

    CheckForClosingBrace();
}